

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_check_circmod(lys_module *module,char *value,int type)

{
  lys_module **pplVar1;
  ly_ctx *ctx;
  ulong uVar2;
  
  ctx = module->ctx;
  if (module->name != value) {
    uVar2 = 0;
    do {
      if ((ctx->models).parsing_sub_modules_count == uVar2) {
        return 0;
      }
      pplVar1 = (ctx->models).parsing_sub_modules + uVar2;
      uVar2 = uVar2 + 1;
    } while ((*pplVar1)->name != value);
  }
  ly_vlog(ctx,(uint)(type == 0) + LYE_CIRC_IMPORTS,LY_VLOG_NONE,(void *)0x0);
  return -1;
}

Assistant:

static int
lyp_check_circmod(struct lys_module *module, const char *value, int type)
{
    LY_ECODE code = type ? LYE_CIRC_IMPORTS : LYE_CIRC_INCLUDES;
    struct ly_modules_list *models = &module->ctx->models;
    uint8_t i;

    /* include/import itself */
    if (ly_strequal(module->name, value, 1)) {
        LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
        return -1;
    }

    /* currently parsed modules */
    for (i = 0; i < models->parsing_sub_modules_count; i++) {
        if (ly_strequal(models->parsing_sub_modules[i]->name, value, 1)) {
            LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
            return -1;
        }
    }

    return 0;
}